

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueStore.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ValueStore::endValueScope(ValueStore *this)

{
  XMLSize_t XVar1;
  int iVar2;
  XMLValidator *pXVar3;
  XMLCh *pXVar4;
  XMLSize_t XVar5;
  XMLCh *text2;
  ValueStore *this_local;
  
  if (this->fValuesCount == 0) {
    iVar2 = (*(this->fIdentityConstraint->super_XSerializable)._vptr_XSerializable[5])();
    if (((short)iVar2 == 1) && ((this->fDoReportError & 1U) != 0)) {
      pXVar3 = XMLScanner::getValidator(this->fScanner);
      pXVar4 = IdentityConstraint::getElementName(this->fIdentityConstraint);
      XMLValidator::emitError
                (pXVar3,IC_AbsentKeyValue,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  else {
    XVar1 = this->fValuesCount;
    XVar5 = IdentityConstraint::getFieldCount(this->fIdentityConstraint);
    if (((XVar1 != XVar5) && ((this->fDoReportError & 1U) != 0)) &&
       (iVar2 = (*(this->fIdentityConstraint->super_XSerializable)._vptr_XSerializable[5])(),
       (short)iVar2 == 1)) {
      pXVar3 = XMLScanner::getValidator(this->fScanner);
      pXVar4 = IdentityConstraint::getElementName(this->fIdentityConstraint);
      text2 = IdentityConstraint::getIdentityConstraintName(this->fIdentityConstraint);
      XMLValidator::emitError(pXVar3,IC_KeyNotEnoughValues,pXVar4,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  return;
}

Assistant:

void ValueStore::endValueScope() {

    if (fValuesCount == 0) {

        if (fIdentityConstraint->getType() == IdentityConstraint::ICType_KEY && fDoReportError) {
            fScanner->getValidator()->emitError(XMLValid::IC_AbsentKeyValue,
                fIdentityConstraint->getElementName());
        }

        return;
    }

    // do we have enough values?
    if ((fValuesCount != fIdentityConstraint->getFieldCount()) && fDoReportError) {

        if(fIdentityConstraint->getType()==IdentityConstraint::ICType_KEY)
        {
			fScanner->getValidator()->emitError(XMLValid::IC_KeyNotEnoughValues,
                fIdentityConstraint->getElementName(), fIdentityConstraint->getIdentityConstraintName());
        }
    }
}